

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

void skipnl(Global *global)

{
  int iVar1;
  Global *in_stack_00000008;
  int c;
  bool local_d;
  
  do {
    iVar1 = get(in_stack_00000008);
    local_d = iVar1 != 10 && iVar1 != 0;
  } while (local_d);
  return;
}

Assistant:

void skipnl(struct Global *global)
{
  /*
   * Skip to the end of the current input line.
   */
  int c;
  
  do {				/* Skip to newline	*/
    c = get(global);
  } while (c != '\n' && c != EOF_CHAR);
  return;
}